

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_ioc_detach_fd(MppDevBufMapNode *node)

{
  uint uVar1;
  MPP_RET MVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 local_30 [4];
  MPP_RET ret;
  MppReqV1 mpp_req;
  RK_S32 fd;
  MppDevBufMapNode *node_local;
  
  mpp_req.data_ptr._4_4_ = node->buf_fd;
  local_30 = (undefined1  [4])0x402;
  ret = ~MPP_ERR_NULL_PTR;
  mpp_req.cmd = 4;
  mpp_req.flag = 0;
  mpp_req._8_8_ = (long)&mpp_req.data_ptr + 4;
  MVar2 = mpp_service_ioctl_request(node->dev_fd,(MppReqV1 *)local_30);
  if (MVar2 != MPP_OK) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    _mpp_log_l(2,"mpp_serivce","failed ret %d errno %d %s\n","mpp_service_ioc_detach_fd",
               (ulong)(uint)MVar2,(ulong)uVar1,pcVar5);
  }
  node->iova = 0xffffffff;
  return MVar2;
}

Assistant:

static MPP_RET mpp_service_ioc_detach_fd(MppDevBufMapNode *node)
{
    RK_S32 fd = node->buf_fd;
    MppReqV1 mpp_req;
    MPP_RET ret;

    mpp_req.cmd = MPP_CMD_RELEASE_FD;
    mpp_req.flag = MPP_FLAGS_LAST_MSG;
    mpp_req.size = sizeof(RK_U32);
    mpp_req.offset = 0;
    mpp_req.data_ptr = REQ_DATA_PTR(&fd);

    ret = mpp_service_ioctl_request(node->dev_fd, &mpp_req);
    if (ret) {
        mpp_err_f("failed ret %d errno %d %s\n", ret, errno, strerror(errno));
    }
    node->iova = (RK_U32)(-1);
    return ret;
}